

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

bool __thiscall rlist::listDelNode(rlist *this,int pos)

{
  unsigned_long uVar1;
  int iVar2;
  listNode *__ptr;
  rlist *this_00;
  long lVar3;
  bool bVar4;
  
  this_00 = this;
  uVar1 = listLength(this);
  iVar2 = pos + -1;
  lVar3 = (long)iVar2;
  if (lVar3 < (long)uVar1) {
    __ptr = this->rl->head;
    while( true ) {
      this->view = __ptr;
      bVar4 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar4) break;
      __ptr = __ptr->next;
    }
    _free(this_00,__ptr);
  }
  return lVar3 < (long)uVar1;
}

Assistant:

bool rlist::listDelNode(int pos){
    long tmp=rlist::listLength();
    pos--;
    if(tmp>pos){
        view=rl->head;
        for(int i=0;i!=pos;i++)
            view=view->next;
        rlist::_free((void *)view);
        return true;
    } 
    return false;
}